

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O1

void __thiscall
pbrt::PixelSensor::PixelSensor
          (PixelSensor *this,RGBColorSpace *outputColorSpace,Float wbTemp,Float imagingRatio,
          Allocator alloc)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int i;
  long lVar6;
  PixelSensor *pPVar7;
  undefined1 auVar8 [12];
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [56];
  undefined1 auVar25 [16];
  XYZ XVar26;
  DenselySampledSpectrum whiteIlluminant;
  DenselySampledSpectrum local_80;
  SpectrumHandle local_58;
  SquareMatrix<3> local_4c;
  undefined1 auVar27 [36];
  
  lVar6 = 0;
  auVar9 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar10 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  pPVar7 = this;
  do {
    auVar11 = vpbroadcastq_avx512f();
    uVar2 = vpcmpeqq_avx512f(auVar11,auVar9);
    uVar3 = vpcmpeqq_avx512f(auVar11,auVar10);
    auVar11 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar3,(char)uVar2));
    auVar11 = vpsrld_avx512f(auVar11,0x1f);
    auVar11 = vcvtdq2ps_avx512f(auVar11);
    iVar4 = (pPVar7->r_bar).lambda_min;
    iVar5 = (pPVar7->r_bar).lambda_max;
    auVar8 = auVar11._0_12_;
    uVar12 = (pPVar7->XYZFromSensorRGB).m[1][0];
    auVar27._12_4_ = uVar12;
    auVar27._0_12_ = auVar8;
    uVar13 = (pPVar7->XYZFromSensorRGB).m[1][1];
    auVar27._16_4_ = uVar13;
    uVar14 = (pPVar7->XYZFromSensorRGB).m[1][2];
    auVar27._20_4_ = uVar14;
    uVar15 = (pPVar7->XYZFromSensorRGB).m[2][0];
    auVar27._24_4_ = uVar15;
    uVar16 = (pPVar7->XYZFromSensorRGB).m[2][1];
    auVar27._28_4_ = uVar16;
    uVar17 = (pPVar7->XYZFromSensorRGB).m[2][2];
    auVar27._32_4_ = uVar17;
    uVar18 = *(undefined4 *)&pPVar7->field_0x24;
    auVar11._36_4_ = uVar18;
    auVar11._0_36_ = auVar27;
    uVar19 = iVar4;
    auVar11._40_4_ = uVar19;
    uVar20 = iVar5;
    auVar11._44_4_ = uVar20;
    uVar21 = *(undefined4 *)&(pPVar7->r_bar).values.alloc.memoryResource;
    auVar11._48_4_ = uVar21;
    uVar22 = *(undefined4 *)((long)&(pPVar7->r_bar).values.alloc.memoryResource + 4);
    auVar11._52_4_ = uVar22;
    auVar11._56_4_ = *(undefined4 *)&(pPVar7->r_bar).values.ptr;
    auVar11._60_4_ = *(undefined4 *)((long)&(pPVar7->r_bar).values.ptr + 4);
    pPVar7->XYZFromSensorRGB = (SquareMatrix<3>)auVar27;
    *(undefined4 *)&pPVar7->field_0x24 = *(undefined4 *)&pPVar7->field_0x24;
    (pPVar7->r_bar).lambda_min = iVar4;
    (pPVar7->r_bar).lambda_max = iVar5;
    (pPVar7->r_bar).values.alloc = (polymorphic_allocator<float>)auVar11._48_8_;
    (pPVar7->r_bar).values.ptr = (float *)auVar11._56_8_;
    lVar6 = lVar6 + 1;
    pPVar7 = (PixelSensor *)((pPVar7->XYZFromSensorRGB).m + 1);
  } while (lVar6 != 3);
  local_80._0_8_ = Spectra::x | 0x2000000000000;
  DenselySampledSpectrum::DenselySampledSpectrum
            (&this->r_bar,(SpectrumHandle *)&local_80,0x168,0x33e,alloc);
  local_80._0_8_ = Spectra::y | 0x2000000000000;
  DenselySampledSpectrum::DenselySampledSpectrum
            (&this->g_bar,(SpectrumHandle *)&local_80,0x168,0x33e,alloc);
  local_80._0_8_ = Spectra::z | 0x2000000000000;
  DenselySampledSpectrum::DenselySampledSpectrum
            (&this->b_bar,(SpectrumHandle *)&local_80,0x168,0x33e,alloc);
  this->imagingRatio = imagingRatio;
  if ((wbTemp != 0.0) || (NAN(wbTemp))) {
    auVar24 = ZEXT856(0);
    Spectra::D(&local_80,wbTemp,alloc);
    local_58.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             )((ulong)&local_80 | 0x2000000000000);
    XVar26 = SpectrumToXYZ(&local_58);
    auVar9._0_8_ = XVar26._0_8_;
    auVar9._8_56_ = auVar24;
    auVar23 = auVar9._0_16_;
    auVar25 = vhaddps_avx(auVar23,auVar23);
    fVar1 = XVar26.Z + auVar25._0_4_;
    auVar25._4_4_ = fVar1;
    auVar25._0_4_ = fVar1;
    auVar25._8_4_ = fVar1;
    auVar25._12_4_ = fVar1;
    auVar25 = vdivps_avx(auVar23,auVar25);
    WhiteBalance(&local_4c,(Point2f)auVar25._0_8_,
                 (Point2f)(outputColorSpace->w).super_Tuple2<pbrt::Point2,_float>);
    (this->XYZFromSensorRGB).m[2][2] = local_4c.m[2][2];
    *(undefined8 *)(this->XYZFromSensorRGB).m[0] = local_4c.m[0]._0_8_;
    *(undefined8 *)((this->XYZFromSensorRGB).m[0] + 2) = local_4c.m._8_8_;
    *(undefined8 *)((this->XYZFromSensorRGB).m[1] + 1) = local_4c.m[1]._4_8_;
    *(undefined8 *)(this->XYZFromSensorRGB).m[2] = local_4c.m[2]._0_8_;
    local_80.values.nStored = 0;
    (*(local_80.values.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_80.values.alloc.memoryResource,local_80.values.ptr,local_80.values.nAlloc << 2,
               4);
  }
  return;
}

Assistant:

PixelSensor(const RGBColorSpace *outputColorSpace, Float wbTemp, Float imagingRatio,
                Allocator alloc)
        : r_bar(&Spectra::X(), alloc),
          g_bar(&Spectra::Y(), alloc),
          b_bar(&Spectra::Z(), alloc),
          imagingRatio(imagingRatio) {
        // Compute white balancing matrix for XYZ _PixelSensor_
        if (wbTemp != 0) {
            auto whiteIlluminant = Spectra::D(wbTemp, alloc);
            Point2f sourceWhite = SpectrumToXYZ(&whiteIlluminant).xy();
            Point2f targetWhite = outputColorSpace->w;
            XYZFromSensorRGB = WhiteBalance(sourceWhite, targetWhite);
        }
    }